

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeLDR(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint64_t Address_00;
  uint64_t Address_01;
  uint64_t Address_02;
  uint64_t Address_03;
  uint RegNo;
  
  RegNo = Val >> 0x10 & 0xf;
  DVar1 = DecodeGPRnopcRegisterClass(Inst,Val >> 0xc & 0xf,Address,Decoder);
  if (((((DVar1 == MCDisassembler_Success) || (DVar1 == MCDisassembler_SoftFail)) &&
       ((DVar1 = DecodeGPRnopcRegisterClass(Inst,RegNo,Address_00,Decoder),
        DVar1 == MCDisassembler_Success || (DVar1 == MCDisassembler_SoftFail)))) &&
      ((DVar1 = DecodeGPRRegisterClass(Inst,RegNo,Address_01,Decoder),
       DVar1 == MCDisassembler_Success || (DVar1 == MCDisassembler_SoftFail)))) &&
     ((DVar1 = DecodePostIdxReg(Inst,Val >> 0x13 & 0x10 | Val & 0xf,Address_02,Decoder),
      DVar1 == MCDisassembler_Success || (DVar1 == MCDisassembler_SoftFail)))) {
    DVar1 = DecodePredicateOperand(Inst,Val >> 0x1c,Address_03,Decoder);
    DVar1 = (*(code *)(&DAT_001cc03c + *(int *)(&DAT_001cc03c + (ulong)DVar1 * 4)))();
    return DVar1;
  }
  return MCDisassembler_Fail;
}

Assistant:

static DecodeStatus DecodeLDR(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Cond;
	unsigned Rn = fieldFromInstruction_4(Val, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Val, 12, 4);
	unsigned Rm = fieldFromInstruction_4(Val, 0, 4);
	Rm |= (fieldFromInstruction_4(Val, 23, 1) << 4);
	Cond = fieldFromInstruction_4(Val, 28, 4);

	if (fieldFromInstruction_4(Val, 8, 4) != 0 || Rn == Rt)
		S = MCDisassembler_SoftFail;

	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeAddrMode7Operand(Inst, Rn, Address, Decoder))) 
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePostIdxReg(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePredicateOperand(Inst, Cond, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}